

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O1

Ptr __thiscall
core::image::raw_to_byte_image(image *this,ConstPtr *image,uint16_t vmin,uint16_t vmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  element_type *peVar5;
  Image<unsigned_char> *__p;
  invalid_argument *this_00;
  uint uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  uint uVar8;
  pointer puVar9;
  Ptr PVar10;
  
  uVar6 = (uint)vmin;
  if ((image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    __p = (Image<unsigned_char> *)operator_new(0x30);
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012fd08;
    *(Image<unsigned_char> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    plVar4 = *(long **)this;
    peVar5 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar1 = (peVar5->super_TypedImageBase<unsigned_short>).super_ImageBase.w;
    iVar2 = (peVar5->super_TypedImageBase<unsigned_short>).super_ImageBase.h;
    iVar3 = (peVar5->super_TypedImageBase<unsigned_short>).super_ImageBase.c;
    (**(code **)(*plVar4 + 0x40))(plVar4);
    *(int *)(plVar4 + 1) = iVar1;
    *(int *)((long)plVar4 + 0xc) = iVar2;
    *(int *)(plVar4 + 2) = iVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar4 + 3),
               (long)(iVar2 * iVar1 * iVar3));
    peVar5 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar9 = (peVar5->super_TypedImageBase<unsigned_short>).data.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var7._M_pi = extraout_RDX;
    if (0 < (int)((ulong)((long)*(pointer *)
                                 ((long)&(peVar5->super_TypedImageBase<unsigned_short>).data.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data + 8) - (long)puVar9) >> 1)
       ) {
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        uVar8 = (uint)puVar9[(long)_Var7._M_pi];
        if (puVar9[(long)_Var7._M_pi] <= vmin) {
          uVar8 = uVar6;
        }
        if (vmax <= (ushort)uVar8) {
          uVar8 = (uint)vmax;
        }
        *(char *)((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + *(long *)(*(long *)this + 0x18)) =
             (char)(int)((double)((int)(((double)(int)(uVar8 - uVar6) * 255.0) /
                                       (double)(int)(vmax - uVar6)) & 0xffff) + 0.5);
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + 1);
        peVar5 = (image->
                 super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        puVar9 = (peVar5->super_TypedImageBase<unsigned_short>).data.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while ((long)_Var7._M_pi <
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(peVar5->super_TypedImageBase<unsigned_short>).
                                                  data.
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar9) >> 1));
    }
    PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var7._M_pi;
    PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
raw_to_byte_image (RawImage::ConstPtr image, uint16_t vmin, uint16_t vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        uint16_t value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0 * static_cast<double>(value - vmin)
            / static_cast<double>(vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5);
    }
    return img;
}